

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_rb_init_ex(size_t subbufferSizeInBytes,size_t subbufferCount,
                       size_t subbufferStrideInBytes,void *pOptionalPreallocatedBuffer,
                       ma_allocation_callbacks *pAllocationCallbacks,ma_rb *pRB)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  ma_result mVar2;
  void *pvVar3;
  void *__s;
  uint uVar4;
  size_t __n;
  
  mVar2 = MA_INVALID_ARGS;
  if ((pRB != (ma_rb *)0x0) &&
     (0xffffffff8000001f < subbufferSizeInBytes - 0x7fffffe1 && subbufferCount != 0)) {
    (pRB->allocationCallbacks).onRealloc = (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0;
    (pRB->allocationCallbacks).onFree = (_func_void_void_ptr_void_ptr *)0x0;
    (pRB->allocationCallbacks).pUserData = (void *)0x0;
    (pRB->allocationCallbacks).onMalloc = (_func_void_ptr_size_t_void_ptr *)0x0;
    pRB->subbufferStrideInBytes = 0;
    pRB->encodedReadOffset = 0;
    pRB->encodedWriteOffset = 0;
    pRB->ownsBuffer = '\0';
    pRB->clearOnWriteAcquire = '\0';
    *(undefined2 *)&pRB->field_0x1e = 0;
    pRB->pBuffer = (void *)0x0;
    pRB->subbufferSizeInBytes = 0;
    pRB->subbufferCount = 0;
    mVar2 = ma_allocation_callbacks_init_copy(&pRB->allocationCallbacks,pAllocationCallbacks);
    if (mVar2 == MA_SUCCESS) {
      pRB->subbufferSizeInBytes = (ma_uint32)subbufferSizeInBytes;
      pRB->subbufferCount = (ma_uint32)subbufferCount;
      if (pOptionalPreallocatedBuffer == (void *)0x0) {
        uVar4 = (ma_uint32)subbufferSizeInBytes + 0x1f & 0xffffffdf;
        pRB->subbufferStrideInBytes = uVar4;
        __n = (ulong)uVar4 * (subbufferCount & 0xffffffff);
        p_Var1 = (pRB->allocationCallbacks).onMalloc;
        if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
          pvVar3 = (void *)0x0;
        }
        else {
          pvVar3 = (*p_Var1)(__n + 0x27,(pRB->allocationCallbacks).pUserData);
        }
        if (pvVar3 == (void *)0x0) {
          __s = (void *)0x0;
        }
        else {
          __s = (void *)((long)pvVar3 + 0x27U & 0xffffffffffffffe0);
          *(void **)((long)__s - 8) = pvVar3;
        }
        pRB->pBuffer = __s;
        if (__s == (void *)0x0) {
          return MA_OUT_OF_MEMORY;
        }
        if (__n != 0) {
          memset(__s,0,__n);
        }
        pRB->ownsBuffer = '\x01';
      }
      else {
        pRB->subbufferStrideInBytes = (ma_uint32)subbufferStrideInBytes;
        pRB->pBuffer = pOptionalPreallocatedBuffer;
      }
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_rb_init_ex(size_t subbufferSizeInBytes, size_t subbufferCount, size_t subbufferStrideInBytes, void* pOptionalPreallocatedBuffer, const ma_allocation_callbacks* pAllocationCallbacks, ma_rb* pRB)
{
    ma_result result;
    const ma_uint32 maxSubBufferSize = 0x7FFFFFFF - (MA_SIMD_ALIGNMENT-1);

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    if (subbufferSizeInBytes == 0 || subbufferCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (subbufferSizeInBytes > maxSubBufferSize) {
        return MA_INVALID_ARGS;    /* Maximum buffer size is ~2GB. The most significant bit is a flag for use internally. */
    }


    MA_ZERO_OBJECT(pRB);

    result = ma_allocation_callbacks_init_copy(&pRB->allocationCallbacks, pAllocationCallbacks);
    if (result != MA_SUCCESS) {
        return result;
    }

    pRB->subbufferSizeInBytes = (ma_uint32)subbufferSizeInBytes;
    pRB->subbufferCount = (ma_uint32)subbufferCount;

    if (pOptionalPreallocatedBuffer != NULL) {
        pRB->subbufferStrideInBytes = (ma_uint32)subbufferStrideInBytes;
        pRB->pBuffer = pOptionalPreallocatedBuffer;
    } else {
        size_t bufferSizeInBytes;

        /*
        Here is where we allocate our own buffer. We always want to align this to MA_SIMD_ALIGNMENT for future SIMD optimization opportunity. To do this
        we need to make sure the stride is a multiple of MA_SIMD_ALIGNMENT.
        */
        pRB->subbufferStrideInBytes = (pRB->subbufferSizeInBytes + (MA_SIMD_ALIGNMENT-1)) & ~MA_SIMD_ALIGNMENT;

        bufferSizeInBytes = (size_t)pRB->subbufferCount*pRB->subbufferStrideInBytes;
        pRB->pBuffer = ma_aligned_malloc(bufferSizeInBytes, MA_SIMD_ALIGNMENT, &pRB->allocationCallbacks);
        if (pRB->pBuffer == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        MA_ZERO_MEMORY(pRB->pBuffer, bufferSizeInBytes);
        pRB->ownsBuffer = MA_TRUE;
    }

    return MA_SUCCESS;
}